

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

void __thiscall
TTD::SlabAllocatorBase<8>::UnlinkAllocation(SlabAllocatorBase<8> *this,void *allocation)

{
  LargeSlabBlock **ppLVar1;
  uint uVar2;
  long lVar3;
  byte *__s;
  LargeSlabBlock *pLVar4;
  LargeSlabBlock *pLVar5;
  LargeSlabBlock *buffer;
  
  if (this->m_reserveActiveBytes != 0) {
    TTDAbort_unrecoverable_error("We don\'t have anything reserved.");
  }
  if (*(long *)((long)allocation + -8) != 0) {
    buffer = (LargeSlabBlock *)((long)allocation + (-8 - *(long *)((long)allocation + -8)));
    ppLVar1 = &buffer->Next;
    *(int *)ppLVar1 = *(int *)ppLVar1 + -1;
    if (*(int *)ppLVar1 != 0) {
      return;
    }
    if (buffer == (LargeSlabBlock *)this->m_headBlock) {
      __s = ((LargeSlabBlock *)this->m_headBlock)->BlockData;
      this->m_currPos = __s;
      this->m_endPos = __s + ((ulong)this->m_slabBlockSize - 0x20);
      memset(__s,0,(ulong)this->m_slabBlockSize - 0x20);
      this->m_headBlock->RefCounter = 0;
      return;
    }
    lVar3 = *(long *)&buffer->TotalBlockSize;
    pLVar4 = buffer->Previous;
    if (pLVar4 != (LargeSlabBlock *)0x0) {
      *(long *)&pLVar4->TotalBlockSize = lVar3;
    }
    if (lVar3 != 0) {
      *(LargeSlabBlock **)(lVar3 + 0x10) = pLVar4;
    }
    uVar2 = this->m_slabBlockSize;
    goto LAB_00803116;
  }
  buffer = (LargeSlabBlock *)((long)allocation + -0x28);
  pLVar4 = *(LargeSlabBlock **)((long)allocation + -0x10);
  if (buffer == this->m_largeBlockList) {
    if (pLVar4 != (LargeSlabBlock *)0x0) {
      TTDAbort_unrecoverable_error("Should always have a null next at head");
    }
    pLVar5 = this->m_largeBlockList->Previous;
    this->m_largeBlockList = pLVar5;
    if (pLVar5 != (LargeSlabBlock *)0x0) {
      pLVar4 = (LargeSlabBlock *)0x0;
      goto LAB_00803105;
    }
  }
  else {
    pLVar5 = *(LargeSlabBlock **)((long)allocation + -0x18);
    if (pLVar4 != (LargeSlabBlock *)0x0) {
      pLVar4->Previous = pLVar5;
    }
    if (pLVar5 != (LargeSlabBlock *)0x0) {
LAB_00803105:
      pLVar5->Next = pLVar4;
    }
  }
  uVar2 = *(uint *)((long)allocation + -0x20);
LAB_00803116:
  Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,(ulong)uVar2);
  return;
}

Assistant:

void UnlinkAllocation(const void* allocation)
        {
            TTDAssert(canUnlink != 0, "Unlink not allowed with this slab allocator.");
            TTDAssert(this->m_reserveActiveBytes == 0, "We don't have anything reserved.");

            //get the meta-data for this allocation and see if it is a
            byte* realBase = ((byte*)allocation) - canUnlink;
            ptrdiff_t offset = *((ptrdiff_t*)realBase);

            if (offset == 0)
            {
                //it is a large allocation just free it
                LargeSlabBlock* largeBlock = (LargeSlabBlock*)(((byte*)allocation) - TTD_LARGE_SLAB_BLOCK_SIZE);

                if (largeBlock == this->m_largeBlockList)
                {
                    TTDAssert(largeBlock->Next == nullptr, "Should always have a null next at head");

                    this->m_largeBlockList = this->m_largeBlockList->Previous;
                    if (this->m_largeBlockList != nullptr)
                    {
                        this->m_largeBlockList->Next = nullptr;
                    }
                }
                else
                {
                    if (largeBlock->Next != nullptr)
                    {
                        largeBlock->Next->Previous = largeBlock->Previous;
                    }

                    if (largeBlock->Previous != nullptr)
                    {
                        largeBlock->Previous->Next = largeBlock->Next;
                    }
                }

                TT_HEAP_FREE_ARRAY(byte, (byte*)largeBlock, largeBlock->TotalBlockSize);
            }
            else
            {
                //lookup the slab block and do ref counting
                SlabBlock* block = (SlabBlock*)(realBase - offset);

                block->RefCounter--;
                if (block->RefCounter == 0)
                {
                    if (block == this->m_headBlock)
                    {
                        //we always need a head block to allocate out of -- so instead of deleting just reset it
                        this->m_currPos = this->m_headBlock->BlockData;
                        this->m_endPos = this->m_headBlock->BlockData + TTD_SLAB_BLOCK_USABLE_SIZE(this->m_slabBlockSize);

                        memset(this->m_currPos, 0, TTD_SLAB_BLOCK_USABLE_SIZE(this->m_slabBlockSize));

                        this->m_headBlock->RefCounter = 0;
                    }
                    else
                    {
                        if (block->Next != nullptr)
                        {
                            block->Next->Previous = block->Previous;
                        }

                        if (block->Previous != nullptr)
                        {
                            block->Previous->Next = block->Next;
                        }

                        TT_HEAP_FREE_ARRAY(byte, (byte*)block, this->m_slabBlockSize);
                    }
                }
            }
        }